

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

int cimg_library::cimg::fclose(FILE *__stream)

{
  uint uVar1;
  
  if (__stream == (FILE *)0x0) {
    uVar1 = 0;
    warn("cimg::fclose() : Specified file is (null).");
  }
  else {
    uVar1 = 0;
    if ((_stdin != __stream) && (uVar1 = 0, _stdout != __stream)) {
      uVar1 = ::fclose(__stream);
      if (uVar1 != 0) {
        warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar1);
      }
    }
  }
  return uVar1;
}

Assistant:

inline int fclose(std::FILE *file) {
      if (!file) warn("cimg::fclose() : Specified file is (null).");
      if (!file || file==stdin || file==stdout) return 0;
      const int errn = std::fclose(file);
      if (errn!=0) warn("cimg::fclose() : Error code %d returned during file closing.",
                        errn);
      return errn;
    }